

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Reader __thiscall capnp::_::OrphanBuilder::asTextReader(OrphanBuilder *this)

{
  SegmentBuilder *segment;
  bool bVar1;
  WirePointer *pWVar2;
  StringPtr SVar3;
  Fault local_28;
  Fault f;
  OrphanBuilder *this_local;
  
  f.exception = (Exception *)this;
  pWVar2 = tagAsPtr(this);
  bVar1 = WirePointer::isNull(pWVar2);
  if (bVar1 == (this->location == (word *)0x0)) {
    segment = this->segment;
    pWVar2 = tagAsPtr(this);
    SVar3.content =
         (ArrayPtr<const_char>)
         WireHelpers::readTextPointer
                   (&segment->super_SegmentReader,pWVar2,this->location,(void *)0x0,0);
    return (StringPtr)(StringPtr)SVar3.content;
  }
  kj::_::Debug::Fault::Fault
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xe25,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","");
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

Text::Reader OrphanBuilder::asTextReader() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readTextPointer(segment, tagAsPtr(), location, nullptr, ZERO * BYTES);
}